

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int32_t mipsdsp_sat32_acc_q31(int32_t acc,int32_t a,CPUMIPSState_conflict5 *env)

{
  target_ulong *ptVar1;
  ulong uVar2;
  
  uVar2 = (long)a + (env->active_tc).LO[acc];
  if (((uint)(uVar2 >> 0x20) & 1) != ((uint)(uVar2 >> 0x1f) & 1)) {
    uVar2 = (ulong)(0x80000000 - ((uVar2 & 0x100000000) == 0));
    ptVar1 = &(env->active_tc).DSPControl;
    *ptVar1 = *ptVar1 | 1L << ((char)acc + 0x10U & 0x3f);
  }
  return (int32_t)uVar2;
}

Assistant:

static inline int32_t mipsdsp_sat32_acc_q31(int32_t acc, int32_t a,
                                            CPUMIPSState *env)
{
    int64_t temp;
    int32_t temp32, temp31, result;
    int64_t temp_sum;

#ifndef TARGET_MIPS64
    temp = ((uint64_t)env->active_tc.HI[acc] << 32) |
           (uint64_t)env->active_tc.LO[acc];
#else
    temp = (uint64_t)env->active_tc.LO[acc];
#endif

    temp_sum = (int64_t)a + temp;

    temp32 = (temp_sum >> 32) & 0x01;
    temp31 = (temp_sum >> 31) & 0x01;
    result = temp_sum & 0xFFFFFFFF;

    if (temp32 != temp31) {
        if (temp32 == 0) {
            result = 0x7FFFFFFF;
        } else {
            result = 0x80000000;
        }
        set_DSPControl_overflow_flag(1, 16 + acc, env);
    }

    return result;
}